

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qicohandler.cpp
# Opt level: O1

void __thiscall ICOReader::read1BitBMP(ICOReader *this,QImage *image)

{
  QIODevice *pQVar1;
  undefined8 uVar2;
  int iVar3;
  long lVar4;
  longlong lVar5;
  long lVar6;
  long in_FS_OFFSET;
  QImage local_60 [16];
  undefined8 local_50;
  undefined8 *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->iod != (QIODevice *)0x0) {
    iVar3 = QImage::height();
    lVar4 = QImage::bytesPerLine();
    do {
      if (iVar3 < 1) goto LAB_00104422;
      iVar3 = iVar3 + -1;
      pQVar1 = this->iod;
      lVar5 = QImage::scanLine((int)image);
      lVar6 = QIODevice::read((char *)pQVar1,lVar5);
    } while (lVar6 == lVar4);
  }
  QImage::QImage(local_60);
  local_38 = 0xaaaaaaaaaaaaaaaa;
  local_48 = (undefined8 *)0xaaaaaaaaaaaaaaaa;
  uStack_40 = 0xaaaaaaaaaaaaaaaa;
  QPaintDevice::QPaintDevice((QPaintDevice *)&local_48);
  uVar2 = local_50;
  local_48 = &QImageIOPlugin::staticMetaObject;
  local_50 = 0;
  local_38 = *(undefined8 *)(image + 0x10);
  *(undefined8 *)(image + 0x10) = uVar2;
  QImage::~QImage((QImage *)&local_48);
  QImage::~QImage(local_60);
LAB_00104422:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ICOReader::read1BitBMP(QImage & image)
{
    if (iod) {

        int h = image.height();
        qsizetype bpl = image.bytesPerLine();

        while (--h >= 0) {
            if (iod->read((char*)image.scanLine(h),bpl) != bpl) {
                image = QImage();
                break;
            }
        }
    } else {
        image = QImage();
    }
}